

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample.cpp
# Opt level: O0

string * hiberlite::Database::getClassName<Person>(void)

{
  string *in_RDI;
  char local_3a [2];
  char *local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  allocator local_12;
  undefined1 local_11;
  string *temp;
  
  local_11 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,"Person",&local_12);
  std::allocator<char>::~allocator((allocator<char> *)&local_12);
  local_30._M_current = (char *)std::__cxx11::string::begin();
  local_38 = (char *)std::__cxx11::string::end();
  local_3a[1] = 0x3a;
  local_3a[0] = '_';
  std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (local_30,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_38,local_3a + 1,local_3a);
  return in_RDI;
}

Assistant:

void createDB()
{
  hiberlite::Database db("sample.db");
  //register bean classes
  db.registerBeanClass<Person>();
  //drop all tables beans will use
  db.dropModel();
  //create those tables again with proper schema
  db.createModel();

  const char* names[5]={"Stanley Marsh", "Kyle Broflovski", "Eric Theodore Cartman", "Kenneth McCormick", "Leopold Stotch"};

  for(unsigned int i=0;i<5;i++) {
    Person x;
    x.name=names[i%5];
    x.age=14+i*0.1;
    x.bio.push_back("Hello");
    x.bio.push_back("world");
    x.bio.push_back("!");

    hiberlite::bean_ptr<Person> p=db.copyBean(x);	//create a managed copy of the object
  }
}